

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringPool.hpp
# Opt level: O0

size_t __thiscall Diligent::StringPool::GetRemainingSize(StringPool *this)

{
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  StringPool *this_local;
  
  if (this->m_pBuffer + this->m_ReservedSize < this->m_pCurrPtr) {
    msg.field_2._8_8_ = this;
    FormatString<char[16]>((string *)local_30,(char (*) [16])"Buffer overflow");
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetRemainingSize",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/interface/StringPool.hpp"
               ,0x9c);
    std::__cxx11::string::~string((string *)local_30);
  }
  return this->m_ReservedSize - ((long)this->m_pCurrPtr - (long)this->m_pBuffer);
}

Assistant:

size_t GetRemainingSize() const
    {
        VERIFY(m_pCurrPtr <= m_pBuffer + m_ReservedSize, "Buffer overflow");
        return m_ReservedSize - (m_pCurrPtr - m_pBuffer);
    }